

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
::rebalance_or_split
          (btree<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           *this,iterator *iter)

{
  int iVar1;
  btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar2;
  undefined4 to_move_00;
  field_type fVar3;
  field_type fVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  node_type *pnVar9;
  int *piVar10;
  allocator_type *paVar11;
  btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar12;
  node_type *pnVar13;
  node_type **ppnVar14;
  node_type *local_68;
  node_type *split_node;
  iterator parent_iter;
  int to_move_1;
  node_type *right;
  btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbStack_38;
  int to_move;
  node_type *left;
  node_type *parent;
  int *insert_position;
  node_type **node;
  iterator *iter_local;
  btree<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *this_local;
  
  parent = (node_type *)&iter->position;
  insert_position = (int *)iter;
  node = &iter->node;
  iter_local = (iterator *)this;
  fVar3 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::count(iter->node);
  fVar4 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::max_count(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                        **)insert_position);
  if (fVar3 != fVar4) {
    __assert_fail("node->count() == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb53,
                  "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                 );
  }
  fVar3 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::max_count(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                        **)insert_position);
  if (fVar3 != '\x1e') {
    __assert_fail("kNodeValues == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb54,
                  "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                 );
  }
  left = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         ::parent(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    **)insert_position);
  pnVar13 = *(node_type **)insert_position;
  pnVar9 = root(this);
  if (pnVar13 == pnVar9) {
    pnVar13 = new_internal_node(this,left);
    left = pnVar13;
    pnVar9 = root(this);
    btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
    ::init_child(pnVar13,0,pnVar9);
    pnVar13 = left;
    ppnVar14 = mutable_root(this);
    *ppnVar14 = pnVar13;
    pbVar12 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::child(left,0);
    bVar7 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            ::leaf(pbVar12);
    bVar8 = true;
    if (bVar7) {
      pbVar12 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::child(left,0);
      bVar8 = pbVar12 == this->rightmost_;
    }
    if (!bVar8) {
      __assert_fail("!parent->child(0)->leaf() || parent->child(0) == rightmost_",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xba0,
                    "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                   );
    }
  }
  else {
    fVar3 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            ::position(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                         **)insert_position);
    pnVar13 = left;
    if (fVar3 != '\0') {
      bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::position(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                           **)insert_position);
      pbStack_38 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                   ::child(pnVar13,(long)(int)(bVar5 - 1));
      fVar3 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::max_count(pbStack_38);
      if (fVar3 != '\x1e') {
        __assert_fail("left->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb5c,
                      "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                     );
      }
      bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::count(pbStack_38);
      if (bVar5 < 0x1e) {
        bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::count(pbStack_38);
        right._4_4_ = (int)(0x1e - (uint)bVar5) / (int)((*(int *)parent < 0x1e) + 1);
        right._0_4_ = 1;
        piVar10 = std::max<int>((int *)&right,(int *)((long)&right + 4));
        right._4_4_ = *piVar10;
        if ((-1 < *(int *)parent - right._4_4_) ||
           (bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    ::count(pbStack_38), (int)((uint)bVar5 + right._4_4_) < 0x1e)) {
          pbVar2 = pbStack_38;
          iVar1 = right._4_4_;
          pbVar12 = *(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      **)insert_position;
          paVar11 = mutable_allocator(this);
          btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::rebalance_right_to_left(pbVar2,iVar1,pbVar12,paVar11);
          bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::max_count(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                                **)insert_position);
          bVar6 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::count(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                            **)insert_position);
          if ((uint)bVar5 - (uint)bVar6 != right._4_4_) {
            __assert_fail("node->max_count() - node->count() == to_move",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xb69,
                          "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                         );
          }
          *(int *)parent = *(int *)parent - right._4_4_;
          if (*(int *)parent < 0) {
            iVar1 = *(int *)parent;
            bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    ::count(pbStack_38);
            *(uint *)parent = iVar1 + (uint)bVar5 + 1;
            *(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              **)insert_position = pbStack_38;
          }
          bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::count(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                            **)insert_position);
          bVar6 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::max_count(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                                **)insert_position);
          if (bVar5 < bVar6) {
            return;
          }
          __assert_fail("node->count() < node->max_count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xb70,
                        "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                       );
        }
      }
    }
    bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            ::position(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                         **)insert_position);
    bVar6 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            ::count(left);
    pnVar13 = left;
    if (bVar5 < bVar6) {
      bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::position(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                           **)insert_position);
      pbVar12 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::child(pnVar13,(long)(int)(bVar5 + 1));
      fVar3 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::max_count(pbVar12);
      if (fVar3 != '\x1e') {
        __assert_fail("right->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb79,
                      "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                     );
      }
      bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::count(pbVar12);
      if (bVar5 < 0x1e) {
        bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::count(pbVar12);
        parent_iter._12_4_ = (int)(0x1e - (uint)bVar5) / (int)((0 < *(int *)parent) + 1);
        parent_iter.position = 1;
        piVar10 = std::max<int>(&parent_iter.position,(int *)&parent_iter.field_0xc);
        parent_iter._12_4_ = *piVar10;
        iVar1 = *(int *)parent;
        bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::count(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                          **)insert_position);
        if ((iVar1 <= (int)((uint)bVar5 - parent_iter._12_4_)) ||
           (bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    ::count(pbVar12), (int)((uint)bVar5 + parent_iter._12_4_) < 0x1e)) {
          to_move_00 = parent_iter._12_4_;
          pbVar2 = *(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                     **)insert_position;
          paVar11 = mutable_allocator(this);
          btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::rebalance_left_to_right(pbVar2,to_move_00,pbVar12,paVar11);
          iVar1 = *(int *)parent;
          bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::count(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                            **)insert_position);
          if ((int)(uint)bVar5 < iVar1) {
            iVar1 = *(int *)parent;
            bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    ::count(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                              **)insert_position);
            *(uint *)parent = (iVar1 - (uint)bVar5) + -1;
            *(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              **)insert_position = pbVar12;
          }
          bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::count(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                            **)insert_position);
          bVar6 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::max_count(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                                **)insert_position);
          if (bVar5 < bVar6) {
            return;
          }
          __assert_fail("node->count() < node->max_count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xb8b,
                        "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                       );
        }
      }
    }
    fVar3 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            ::max_count(left);
    if (fVar3 != '\x1e') {
      __assert_fail("parent->max_count() == kNodeValues",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xb93,
                    "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                   );
    }
    fVar3 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            ::count(left);
    if (fVar3 == '\x1e') {
      pbVar12 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::parent(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                           **)insert_position);
      bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::position(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                           **)insert_position);
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
      ::btree_iterator((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                        *)&split_node,pbVar12,(uint)bVar5);
      rebalance_or_split(this,(iterator *)&split_node);
    }
  }
  bVar8 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::leaf(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                   **)insert_position);
  if (bVar8) {
    local_68 = new_leaf_node(this,left);
    pbVar12 = *(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                **)insert_position;
    iVar1 = *(int *)parent;
    paVar11 = mutable_allocator(this);
    btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
    ::split(pbVar12,iVar1,local_68,paVar11);
    if (this->rightmost_ == *(node_type **)insert_position) {
      this->rightmost_ = local_68;
    }
  }
  else {
    local_68 = new_internal_node(this,left);
    pbVar12 = *(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                **)insert_position;
    iVar1 = *(int *)parent;
    paVar11 = mutable_allocator(this);
    btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
    ::split(pbVar12,iVar1,local_68,paVar11);
  }
  iVar1 = *(int *)parent;
  bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::count(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    **)insert_position);
  if ((int)(uint)bVar5 < iVar1) {
    iVar1 = *(int *)parent;
    bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            ::count(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      **)insert_position);
    *(uint *)parent = (iVar1 - (uint)bVar5) + -1;
    *(node_type **)insert_position = local_68;
  }
  return;
}

Assistant:

void btree<P>::rebalance_or_split(iterator *iter) {
        node_type *&node = iter->node;
        int &insert_position = iter->position;
        assert(node->count() == node->max_count());
        assert(kNodeValues == node->max_count());

        // First try to make room on the node by rebalancing.
        node_type *parent = node->parent();
        if (node != root()) {
            if (node->position() > 0) {
                // Try rebalancing with our left sibling.
                node_type *left = parent->child(node->position() - 1);
                assert(left->max_count() == kNodeValues);
                if (left->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the end of the right node then we bias rebalancing to
                    // fill up the left node.
                    int to_move = (kNodeValues - left->count()) /
                        (1 + (insert_position < kNodeValues));
                    to_move = (std::max)(1, to_move);

                    if (((insert_position - to_move) >= 0) ||
                        ((left->count() + to_move) < kNodeValues)) {
                        left->rebalance_right_to_left(to_move, node, mutable_allocator());

                        assert(node->max_count() - node->count() == to_move);
                        insert_position = insert_position - to_move;
                        if (insert_position < 0) {
                            insert_position = insert_position + left->count() + 1;
                            node = left;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            if (node->position() < parent->count()) {
                // Try rebalancing with our right sibling.
                node_type *right = parent->child(node->position() + 1);
                assert(right->max_count() == kNodeValues);
                if (right->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the _beginning of the left node then we bias rebalancing
                    // to fill up the right node.
                    int to_move =
                        (kNodeValues - right->count()) / (1 + (insert_position > 0));
                    to_move = (std::max)(1, to_move);

                    if ((insert_position <= (node->count() - to_move)) ||
                        ((right->count() + to_move) < kNodeValues)) {
                        node->rebalance_left_to_right(to_move, right, mutable_allocator());

                        if (insert_position > node->count()) {
                            insert_position = insert_position - node->count() - 1;
                            node = right;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            // Rebalancing failed, make sure there is room on the parent node for a new
            // value.
            assert(parent->max_count() == kNodeValues);
            if (parent->count() == kNodeValues) {
                iterator parent_iter(node->parent(), node->position());
                rebalance_or_split(&parent_iter);
            }
        } else {
            // Rebalancing not possible because this is the root node.
            // Create a new root node and set the current root node as the child of the
            // new root.
            parent = new_internal_node(parent);
            parent->init_child(0, root());
            mutable_root() = parent;
            // If the former root was a leaf node, then it's now the rightmost node.
            assert(!parent->child(0)->leaf() || parent->child(0) == rightmost_);
        }

        // Split the node.
        node_type *split_node;
        if (node->leaf()) {
            split_node = new_leaf_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
            if (rightmost_ == node) rightmost_ = split_node;
        } else {
            split_node = new_internal_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
        }

        if (insert_position > node->count()) {
            insert_position = insert_position - node->count() - 1;
            node = split_node;
        }
    }